

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

Vector3f __thiscall
Renderer::estimatePixel(Renderer *this,Ray *ray,float tmin,float length,int iters)

{
  uint in_ECX;
  undefined4 in_register_00000014;
  Vector3f VVar1;
  Vector3f color;
  float local_6c;
  Renderer *local_68;
  float local_60;
  Vector3f local_5c;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_6c = tmin;
  local_68 = this;
  local_60 = length;
  Vector3f::Vector3f(&local_5c,0.0);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x28);
  *(Ray **)local_50._M_unused._0_8_ = ray;
  *(ulong *)((long)local_50._M_unused._0_8_ + 8) = CONCAT44(in_register_00000014,iters);
  *(float **)((long)local_50._M_unused._0_8_ + 0x10) = &local_6c;
  *(float **)((long)local_50._M_unused._0_8_ + 0x18) = &local_60;
  *(Vector3f **)((long)local_50._M_unused._0_8_ + 0x20) = &local_5c;
  local_38 = std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Renderer.cpp:28:25)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Renderer.cpp:28:25)>
             ::_M_manager;
  parallel_for(in_ECX,(function<void_(int,_int)> *)&local_50,100.0 < length);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  VVar1 = operator/((Vector3f *)local_68,(float)(int)in_ECX);
  return (Vector3f)VVar1.m_elements;
}

Assistant:

Vector3f Renderer::estimatePixel(const Ray &ray, float tmin, float length, int iters) {
    // Average over multiple iterations.
    Vector3f color;
    parallel_for(iters, [&](int start, int end) {
        for (int i = start; i < end; i++) {
            // 1. Choose a light
            std::default_random_engine generator(rand());
            std::uniform_int_distribution<int> uniform(0, _scene.lights.size() - 1);
            Object3D *light = _scene.lights[uniform(generator)];

            float prob_path = 1;

            std::vector<Ray> eye_path;
            std::vector<Ray> light_path;
            std::vector<Hit> eye_hits;
            std::vector<Hit> light_hits;

            choosePath(ray, light, tmin, length, prob_path, eye_path, eye_hits, light_path, light_hits);
            Vector3f path_color = colorPath(tmin, light, eye_path, eye_hits, light_path, light_hits);
            color += path_color;
        }
    }, length > 100);
    return color / (float) iters;
}